

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.cpp
# Opt level: O2

Symbol * sym_AddMacro(char *symName,int32_t defLineNo,char *body,size_t size)

{
  Symbol *sym;
  
  sym = createNonrelocSymbol(symName,false);
  if (sym != (Symbol *)0x0) {
    sym->type = SYM_MACRO;
    (sym->field_8).field_2.macroSize = size;
    (sym->field_8).field_2.macro = body;
    setSymbolFilename(sym);
    sym->fileLine = defLineNo;
  }
  return sym;
}

Assistant:

struct Symbol *sym_AddMacro(char const *symName, int32_t defLineNo, char *body, size_t size)
{
	struct Symbol *sym = createNonrelocSymbol(symName, false);

	if (!sym)
		return NULL;

	sym->type = SYM_MACRO;
	sym->macroSize = size;
	sym->macro = body;
	setSymbolFilename(sym); // TODO: is this really necessary?
	// The symbol is created at the line after the `endm`,
	// override this with the actual definition line
	sym->fileLine = defLineNo;

	return sym;
}